

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  long lVar1;
  _Bool _Var2;
  char *pcVar3;
  
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  lVar1 = source->version_max;
  dest->version = source->version;
  dest->version_max = lVar1;
  if (source->CAfile == (char *)0x0) {
    dest->CAfile = (char *)0x0;
LAB_005f5d14:
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_005f5d9e;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_005f5d9e;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_005f5d9e;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_005f5d9e;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
      _Var2 = source->sessionid;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar3;
      _Var2 = false;
      if (pcVar3 == (char *)0x0) {
        return false;
      }
    }
    dest->sessionid = _Var2;
    _Var2 = true;
  }
  else {
    pcVar3 = (*Curl_cstrdup)(source->CAfile);
    dest->CAfile = pcVar3;
    if (pcVar3 != (char *)0x0) goto LAB_005f5d14;
LAB_005f5d9e:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  dest->version = source->version;
  dest->version_max = source->version_max;

  CLONE_STRING(CAfile);
  CLONE_STRING(CApath);
  CLONE_STRING(cipher_list);
  CLONE_STRING(egdsocket);
  CLONE_STRING(random_file);
  CLONE_STRING(clientcert);

  /* Disable dest sessionid cache if a client cert is used, CVE-2016-5419. */
  dest->sessionid = (dest->clientcert ? false : source->sessionid);
  return TRUE;
}